

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

int Abc_NodeRefDeref(Abc_Obj_t *pNode,int fReference,int fLabel)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pNode_01;
  int local_34;
  int Counter;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  int fLabel_local;
  int fReference_local;
  Abc_Obj_t *pNode_local;
  
  if (fLabel != 0) {
    Abc_NodeSetTravIdCurrent(pNode);
  }
  iVar1 = Abc_ObjIsCi(pNode);
  if (iVar1 == 0) {
    pNode_00 = Abc_ObjFanin0(pNode);
    pNode_01 = Abc_ObjFanin1(pNode);
    local_34 = 1;
    if (fReference == 0) {
      if ((pNode_00->vFanouts).nSize < 1) {
        __assert_fail("pNode0->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0x95,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
      }
      if ((pNode_01->vFanouts).nSize < 1) {
        __assert_fail("pNode1->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0x96,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
      }
      iVar1 = (pNode_00->vFanouts).nSize + -1;
      (pNode_00->vFanouts).nSize = iVar1;
      if (iVar1 == 0) {
        local_34 = Abc_NodeRefDeref(pNode_00,0,fLabel);
        local_34 = local_34 + 1;
      }
      iVar1 = (pNode_01->vFanouts).nSize + -1;
      (pNode_01->vFanouts).nSize = iVar1;
      if (iVar1 == 0) {
        iVar1 = Abc_NodeRefDeref(pNode_01,0,fLabel);
        local_34 = iVar1 + local_34;
      }
    }
    else {
      iVar1 = (pNode_00->vFanouts).nSize;
      (pNode_00->vFanouts).nSize = iVar1 + 1;
      if (iVar1 == 0) {
        local_34 = Abc_NodeRefDeref(pNode_00,fReference,fLabel);
        local_34 = local_34 + 1;
      }
      iVar1 = (pNode_01->vFanouts).nSize;
      (pNode_01->vFanouts).nSize = iVar1 + 1;
      if (iVar1 == 0) {
        iVar1 = Abc_NodeRefDeref(pNode_01,fReference,fLabel);
        local_34 = iVar1 + local_34;
      }
    }
    pNode_local._4_4_ = local_34;
  }
  else {
    pNode_local._4_4_ = 0;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeRefDeref( Abc_Obj_t * pNode, int fReference, int fLabel )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // label visited nodes
    if ( fLabel )
        Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    return Counter;
}